

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-mpi.c
# Opt level: O0

int big_block_mpi_grow_simple(BigBlock *bb,int Nfile_grow,size_t size_grow,MPI_Comm comm)

{
  long lVar1;
  size_t *fsize_grow;
  MPI_Comm comm_00;
  BigBlock *bb_00;
  int iVar2;
  undefined8 uStack_60;
  size_t sStack_58;
  ulong local_50;
  size_t *local_48;
  undefined1 local_40 [4];
  int local_3c;
  int rank;
  int i;
  unsigned_long __vla_expr0;
  MPI_Comm local_28;
  MPI_Comm comm_local;
  size_t size_grow_local;
  BigBlock *pBStack_10;
  int Nfile_grow_local;
  BigBlock *bb_local;
  
  __vla_expr0 = (unsigned_long)&sStack_58;
  _rank = (ulong)(uint)Nfile_grow;
  lVar1 = -(_rank * 8 + 0xf & 0xfffffffffffffff0);
  local_48 = (size_t *)((long)&sStack_58 + lVar1);
  for (local_3c = 0; local_3c < Nfile_grow; local_3c = local_3c + 1) {
    local_50 = (size_grow * (long)(local_3c + 1)) / (ulong)(long)Nfile_grow;
    local_48[local_3c] = local_50 - (size_grow * (long)local_3c) / (ulong)(long)Nfile_grow;
  }
  local_28 = comm;
  comm_local = (MPI_Comm)size_grow;
  size_grow_local._4_4_ = Nfile_grow;
  pBStack_10 = bb;
  *(undefined8 *)((long)&uStack_60 + lVar1) = 0x10493e;
  MPI_Comm_rank(comm,local_40);
  bb_00 = pBStack_10;
  iVar2 = size_grow_local._4_4_;
  comm_00 = local_28;
  fsize_grow = local_48;
  *(undefined8 *)((long)&uStack_60 + lVar1) = 0x104952;
  iVar2 = big_block_mpi_grow(bb_00,iVar2,fsize_grow,comm_00);
  return iVar2;
}

Assistant:

int
big_block_mpi_grow_simple(BigBlock * bb, int Nfile_grow, size_t size_grow, MPI_Comm comm)
{
    size_t fsize[Nfile_grow];
    int i;
    for(i = 0; i < Nfile_grow; i ++) {
        fsize[i] = size_grow * (i + 1) / Nfile_grow
                 - size_grow * (i) / Nfile_grow;
    }
    int rank;
    MPI_Comm_rank(comm, &rank);

    return big_block_mpi_grow(bb, Nfile_grow, fsize, comm);
}